

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_snapshots.cpp
# Opt level: O2

bool writeError(path *fname,FILE **fileToClose)

{
  int iVar1;
  string local_30;
  
  std::filesystem::__cxx11::path::string(&local_30,fname);
  Error("Write error (disk full?)",local_30._M_dataplus._M_p,IF_FIRST);
  std::__cxx11::string::~string((string *)&local_30);
  iVar1 = fclose((FILE *)*fileToClose);
  return SUB41(iVar1,0);
}

Assistant:

static bool writeError(const std::filesystem::path & fname, FILE* & fileToClose) {
	Error("Write error (disk full?)", fname.string().c_str(), IF_FIRST);
	fclose(fileToClose);
	return false;
}